

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  bool bVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string srcFiles;
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  string local_50;
  
  local_70._0_8_ = local_98 + 0x38;
  local_70._8_8_ = (_Elt_pointer)0x0;
  local_70[0x10] = 0;
  pbVar2 = (srcs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98._32_8_ =
       (srcs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar2 == (pointer)local_98._32_8_) {
      if ((_Elt_pointer)local_70._8_8_ != (_Elt_pointer)0x0) {
        cmMakefile::GetBacktrace((cmMakefile *)local_98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->SourceEntries
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_98 + 0x28));
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    SourceBacktraces,(value_type *)local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
      break;
    }
    std::__cxx11::string::string((string *)local_98,(string *)pbVar2);
    if ((ulong)local_98._8_8_ < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001d3ef8;
LAB_001d3f21:
      cmMakefile::GetOrCreateSource
                (((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                 (string *)local_98,false,Ambiguous);
LAB_001d3f34:
      std::__cxx11::string::append(local_98 + 0x28);
      bVar1 = true;
      std::__cxx11::string::append((string *)(local_98 + 0x28));
    }
    else {
      if ((*(char *)local_98._0_8_ == '$') && (*(char *)(local_98._0_8_ + 1) == '<'))
      goto LAB_001d3f34;
LAB_001d3ef8:
      cmTargetInternals::ProcessSourceItemCMP0049
                (&local_50,
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl,(string *)local_98)
      ;
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001d3f21;
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_98);
    pbVar2 = pbVar2 + 1;
  } while (bVar1);
  std::__cxx11::string::~string((string *)(local_98 + 0x28));
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (auto filename : srcs) {
    if (!cmGeneratorExpression::StartsWithGeneratorExpression(filename)) {
      if (!filename.empty()) {
        filename = impl->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      impl->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
    impl->SourceEntries.push_back(std::move(srcFiles));
    impl->SourceBacktraces.push_back(lfbt);
  }
}